

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O1

void __thiscall
Potassco::SmodelsInput::SymTab::add(SymTab *this,Atom_t id,StringSpan *name,bool output)

{
  Lit_t lit;
  uint *local_78;
  undefined8 local_70;
  uint local_68 [2];
  undefined4 uStack_60;
  undefined4 uStack_5c;
  uint **local_58;
  undefined8 local_50;
  uint local_48 [2];
  undefined4 uStack_40;
  undefined4 uStack_3c;
  Atom_t local_38;
  
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,name->first,name->first + name->size);
  if (local_78 == local_68) {
    uStack_40 = uStack_60;
    uStack_3c = uStack_5c;
    local_58 = (uint **)local_48;
  }
  else {
    local_58 = (uint **)local_78;
  }
  local_50 = local_70;
  local_70 = 0;
  local_68[0] = local_68[0] & 0xffffff00;
  local_78 = local_68;
  local_38 = id;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,unsigned_int>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->atoms);
  if (local_58 != (uint **)local_48) {
    operator_delete(local_58);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if (output) {
    local_78 = (uint *)CONCAT44(local_78._4_4_,id);
    local_58 = &local_78;
    local_50 = 1;
    (*this->out->_vptr_AbstractProgram[8])(this->out,name);
  }
  return;
}

Assistant:

virtual void add(Atom_t id, const StringSpan& name, bool output) {
		atoms.insert(StrMap::value_type(std::string(Potassco::begin(name), Potassco::end(name)), id));
		if (output) {
			Lit_t lit = static_cast<Lit_t>(id);
			out->output(name, toSpan(&lit, 1));
		}
	}